

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O3

void baryonyx::itm::
     init_with_pre_solve<baryonyx::itm::quadratic_cost_type<double>,baryonyx::itm::maximize_tag>
               (bit_array *x_pessimistic,bit_array *x_optimistic,random_engine *rng,
               quadratic_cost_type<double> *c,
               vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
               *constraints,double init_random)

{
  pointer pmVar1;
  pointer pfVar2;
  double *pdVar3;
  quad *pqVar4;
  bool bVar5;
  byte bVar6;
  undefined1 auVar7 [16];
  pointer prVar8;
  pointer prVar9;
  pointer pmVar10;
  ulong uVar11;
  int *piVar12;
  long unaff_RBX;
  merged_constraint *cst;
  int iVar13;
  int iVar14;
  uint uVar15;
  long lVar16;
  ulong uVar17;
  size_type __n;
  int iVar18;
  ulong uVar19;
  ulong uVar20;
  uint uVar21;
  quad *pqVar22;
  long lVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [32];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  double dVar32;
  undefined1 auVar33 [64];
  vector<reduced_cost,_std::allocator<reduced_cost>_> R;
  _Adaptor<std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>,_double>
  __aurng;
  allocator_type local_71;
  ulong local_70;
  vector<reduced_cost,_std::allocator<reduced_cost>_> local_68;
  random_engine *local_50;
  quadratic_cost_type<double> *local_48;
  pointer local_40;
  double local_38;
  undefined1 auVar26 [32];
  
  pmVar10 = (constraints->
            super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pmVar1 = (constraints->
           super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pmVar10 == pmVar1) {
    __n = 0;
  }
  else {
    auVar27 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    vpmovsxwd_avx2(_DAT_0062c790);
    lVar16 = -0x28 - (long)pmVar10;
    uVar11 = 0;
    auVar28 = vpbroadcastq_avx512f();
    auVar29 = vpsrlq_avx512f(auVar28,5);
    auVar28 = ZEXT1664((undefined1  [16])0x0);
    do {
      auVar33 = auVar28;
      auVar28 = vpbroadcastq_avx512f();
      uVar11 = uVar11 + 8;
      auVar28 = vporq_avx512f(auVar28,auVar27);
      uVar20 = vpcmpuq_avx512f(auVar28,auVar29,2);
      auVar28 = vpgatherdq_avx512f(*(undefined4 *)
                                    ((long)&(pmVar10->elements).
                                            super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                                            ._M_impl.super__Vector_impl_data._M_finish + unaff_RBX))
      ;
      bVar6 = (byte)uVar20;
      auVar30._8_8_ = (ulong)((byte)(uVar20 >> 1) & 1) * auVar28._8_8_;
      auVar30._0_8_ = (ulong)(bVar6 & 1) * auVar28._0_8_;
      auVar30._16_8_ = (ulong)((byte)(uVar20 >> 2) & 1) * auVar28._16_8_;
      auVar30._24_8_ = (ulong)((byte)(uVar20 >> 3) & 1) * auVar28._24_8_;
      auVar30._32_8_ = (ulong)((byte)(uVar20 >> 4) & 1) * auVar28._32_8_;
      auVar30._40_8_ = (ulong)((byte)(uVar20 >> 5) & 1) * auVar28._40_8_;
      auVar30._48_8_ = (ulong)((byte)(uVar20 >> 6) & 1) * auVar28._48_8_;
      auVar30._56_8_ = (uVar20 >> 7) * auVar28._56_8_;
      auVar28 = vpgatherdq_avx512f(*(undefined4 *)
                                    ((long)&(pmVar10->elements).
                                            super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                                            ._M_impl.super__Vector_impl_data._M_start + unaff_RBX));
      auVar31._8_8_ = (ulong)((byte)(uVar20 >> 1) & 1) * auVar28._8_8_;
      auVar31._0_8_ = (ulong)(bVar6 & 1) * auVar28._0_8_;
      auVar31._16_8_ = (ulong)((byte)(uVar20 >> 2) & 1) * auVar28._16_8_;
      auVar31._24_8_ = (ulong)((byte)(uVar20 >> 3) & 1) * auVar28._24_8_;
      auVar31._32_8_ = (ulong)((byte)(uVar20 >> 4) & 1) * auVar28._32_8_;
      auVar31._40_8_ = (ulong)((byte)(uVar20 >> 5) & 1) * auVar28._40_8_;
      auVar31._48_8_ = (ulong)((byte)(uVar20 >> 6) & 1) * auVar28._48_8_;
      auVar31._56_8_ = (uVar20 >> 7) * auVar28._56_8_;
      pmVar10 = pmVar10 + 8;
      auVar28 = vpsubq_avx512f(auVar30,auVar31);
      auVar28 = vpsrlq_avx512f(auVar28,3);
      auVar25 = vpmovqd_avx512f(auVar28);
      auVar25 = vpmaxsd_avx2(auVar33._0_32_,auVar25);
      auVar28 = ZEXT3264(auVar25);
    } while (((ulong)((long)pmVar1 + lVar16) / 0x28 + 8 & 0xfffffffffffffff8) != uVar11);
    auVar25 = vmovdqa32_avx512vl(auVar25);
    auVar24._0_4_ = (uint)(bVar6 & 1) * auVar25._0_4_ | (uint)!(bool)(bVar6 & 1) * auVar33._0_4_;
    bVar5 = (bool)((byte)(uVar20 >> 1) & 1);
    auVar24._4_4_ = (uint)bVar5 * auVar25._4_4_ | (uint)!bVar5 * auVar33._4_4_;
    bVar5 = (bool)((byte)(uVar20 >> 2) & 1);
    auVar24._8_4_ = (uint)bVar5 * auVar25._8_4_ | (uint)!bVar5 * auVar33._8_4_;
    bVar5 = (bool)((byte)(uVar20 >> 3) & 1);
    auVar24._12_4_ = (uint)bVar5 * auVar25._12_4_ | (uint)!bVar5 * auVar33._12_4_;
    bVar5 = (bool)((byte)(uVar20 >> 4) & 1);
    auVar26._16_4_ = (uint)bVar5 * auVar25._16_4_ | (uint)!bVar5 * auVar33._16_4_;
    auVar26._0_16_ = auVar24;
    bVar5 = (bool)((byte)(uVar20 >> 5) & 1);
    auVar26._20_4_ = (uint)bVar5 * auVar25._20_4_ | (uint)!bVar5 * auVar33._20_4_;
    bVar5 = (bool)((byte)(uVar20 >> 6) & 1);
    auVar26._24_4_ = (uint)bVar5 * auVar25._24_4_ | (uint)!bVar5 * auVar33._24_4_;
    bVar5 = SUB81(uVar20 >> 7,0);
    auVar26._28_4_ = (uint)bVar5 * auVar25._28_4_ | (uint)!bVar5 * auVar33._28_4_;
    auVar24 = vpmaxsd_avx(auVar24,auVar26._16_16_);
    auVar7 = vpshufd_avx(auVar24,0xee);
    auVar24 = vpmaxsd_avx(auVar24,auVar7);
    auVar7 = vpshufd_avx(auVar24,0x55);
    auVar24 = vpmaxsd_avx(auVar24,auVar7);
    __n = CONCAT44((int)((ulong)x_optimistic >> 0x20),auVar24._0_4_);
  }
  local_50 = rng;
  local_48 = c;
  local_38 = init_random;
  std::vector<reduced_cost,_std::allocator<reduced_cost>_>::vector(&local_68,__n,&local_71);
  local_40 = (constraints->
             super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  pmVar10 = (constraints->
            super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if (pmVar10 != local_40) {
    do {
      dVar32 = std::
               generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                         (local_50);
      if (dVar32 < local_38) {
        std::vector<reduced_cost,_std::allocator<reduced_cost>_>::resize
                  (&local_68,
                   (long)(pmVar10->elements).
                         super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(pmVar10->elements).
                         super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3);
        pfVar2 = (pmVar10->elements).
                 super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_70 = (ulong)((long)(pmVar10->elements).
                                 super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)pfVar2) >> 3;
        if ((int)local_70 != 0) {
          pdVar3 = (local_48->linear_elements)._M_t.
                   super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                   super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                   super__Head_base<0UL,_double_*,_false>._M_head_impl;
          pqVar4 = (local_48->quadratic_elements)._M_t.
                   super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
                   .super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_false>
                   ._M_head_impl;
          piVar12 = (local_48->indices)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>
                    ._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                    super__Head_base<0UL,_int_*,_false>._M_head_impl;
          uVar11 = 0;
          do {
            iVar18 = pfVar2[uVar11].variable_index;
            dVar32 = pdVar3[iVar18];
            iVar14 = piVar12[iVar18];
            iVar13 = piVar12[(long)iVar18 + 1];
            if (iVar13 != iVar14) {
              iVar13 = iVar13 - iVar14;
              pqVar22 = pqVar4 + iVar14;
              do {
                dVar32 = dVar32 + pqVar22->factor;
                pqVar22 = pqVar22 + 1;
                iVar13 = iVar13 + -1;
              } while (iVar13 != 0);
            }
            local_68.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>._M_impl.
            super__Vector_impl_data._M_start[uVar11].value = (float)dVar32;
            uVar20 = uVar11 + 1;
            local_68.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>._M_impl.
            super__Vector_impl_data._M_start[uVar11].factor = pfVar2[uVar11].factor;
            local_68.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>._M_impl.
            super__Vector_impl_data._M_start[uVar11].id = iVar18;
            uVar11 = uVar20;
          } while (uVar20 != (local_70 & 0xffffffff));
        }
        std::
        shuffle<__gnu_cxx::__normal_iterator<baryonyx::itm::init_with_pre_solve<baryonyx::itm::quadratic_cost_type<double>,baryonyx::itm::maximize_tag>(baryonyx::bit_array&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,baryonyx::itm::quadratic_cost_type<double>const&,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,double)::reduced_cost*,std::vector<baryonyx::itm::init_with_pre_solve<baryonyx::itm::quadratic_cost_type<double>,baryonyx::itm::maximize_tag>(baryonyx::bit_array&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,baryonyx::itm::quadratic_cost_type<double>const&,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,double)::reduced_cost,std::allocator<baryonyx::itm::init_with_pre_solve<baryonyx::itm::quadratic_cost_type<double>,baryonyx::itm::maximize_tag>(baryonyx::bit_array&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,baryonyx::itm::quadratic_cost_type<double>const&,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,double)::reduced_cost>>>,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                  ((__normal_iterator<reduced_cost_*,_std::vector<reduced_cost,_std::allocator<reduced_cost>_>_>
                    )local_68.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                   (__normal_iterator<reduced_cost_*,_std::vector<reduced_cost,_std::allocator<reduced_cost>_>_>
                    )local_68.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>.
                     _M_impl.super__Vector_impl_data._M_finish,local_50);
        prVar9 = local_68.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        prVar8 = local_68.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (local_68.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>._M_impl.
            super__Vector_impl_data._M_start !=
            local_68.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          std::
          __introsort_loop<__gnu_cxx::__normal_iterator<baryonyx::itm::init_with_pre_solve<baryonyx::itm::quadratic_cost_type<double>,baryonyx::itm::maximize_tag>(baryonyx::bit_array&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,baryonyx::itm::quadratic_cost_type<double>const&,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,double)::reduced_cost*,std::vector<baryonyx::itm::init_with_pre_solve<baryonyx::itm::quadratic_cost_type<double>,baryonyx::itm::maximize_tag>(baryonyx::bit_array&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,baryonyx::itm::quadratic_cost_type<double>const&,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,double)::reduced_cost,std::allocator<baryonyx::itm::init_with_pre_solve<baryonyx::itm::quadratic_cost_type<double>,baryonyx::itm::maximize_tag>(baryonyx::bit_array&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,baryonyx::itm::quadratic_cost_type<double>const&,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,double)::reduced_cost>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::init_with_pre_solve<baryonyx::itm::quadratic_cost_type<double>,baryonyx::itm::maximize_tag>(baryonyx::bit_array&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,baryonyx::itm::quadratic_cost_type<double>const&,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,double)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    (local_68.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     local_68.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>.
                     _M_impl.super__Vector_impl_data._M_finish,
                     (int)LZCOUNT(((long)local_68.
                                         super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_68.
                                         super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 2) *
                                  -0x5555555555555555) * 2 ^ 0x7e);
          std::
          __final_insertion_sort<__gnu_cxx::__normal_iterator<baryonyx::itm::init_with_pre_solve<baryonyx::itm::quadratic_cost_type<double>,baryonyx::itm::maximize_tag>(baryonyx::bit_array&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,baryonyx::itm::quadratic_cost_type<double>const&,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,double)::reduced_cost*,std::vector<baryonyx::itm::init_with_pre_solve<baryonyx::itm::quadratic_cost_type<double>,baryonyx::itm::maximize_tag>(baryonyx::bit_array&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,baryonyx::itm::quadratic_cost_type<double>const&,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,double)::reduced_cost,std::allocator<baryonyx::itm::init_with_pre_solve<baryonyx::itm::quadratic_cost_type<double>,baryonyx::itm::maximize_tag>(baryonyx::bit_array&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,baryonyx::itm::quadratic_cost_type<double>const&,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,double)::reduced_cost>>>,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::init_with_pre_solve<baryonyx::itm::quadratic_cost_type<double>,baryonyx::itm::maximize_tag>(baryonyx::bit_array&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,baryonyx::itm::quadratic_cost_type<double>const&,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,double)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    (prVar8,prVar9);
        }
        if ((x_pessimistic->super_bit_array_impl).m_data._M_t.
            super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
            super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
            super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl != (unsigned_long *)0x0) {
          if (-1 < (int)(uint)local_70) {
            uVar11 = (ulong)((uint)local_70 & 0x7fffffff);
            uVar20 = 0;
            iVar18 = 0;
            piVar12 = &(local_68.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>.
                        _M_impl.super__Vector_impl_data._M_start)->factor;
LAB_00183a5e:
            if ((iVar18 < pmVar10->min) || (pmVar10->max < iVar18)) goto LAB_00183a68;
            if (-1 < (long)(uVar20 - 1)) {
              lVar16 = 8;
              uVar11 = uVar20;
              do {
                bit_array_impl::set(&x_pessimistic->super_bit_array_impl,
                                    *(int *)((long)&(local_68.
                                                  super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->value
                                            + lVar16));
                lVar16 = lVar16 + 0xc;
                uVar11 = uVar11 - 1;
              } while (uVar11 != 0);
              goto LAB_00183aac;
            }
          }
LAB_00183aa9:
          uVar20 = 0;
LAB_00183aac:
          if ((int)uVar20 != (int)local_70) {
            lVar16 = (uVar20 & 0xffffffff) * 0xc + 8;
            lVar23 = (uVar20 & 0xffffffff) - (local_70 & 0xffffffff);
            do {
              bit_array_impl::unset
                        (&x_pessimistic->super_bit_array_impl,
                         *(int *)((long)&(local_68.
                                          super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->value + lVar16
                                 ));
              lVar16 = lVar16 + 0xc;
              lVar23 = lVar23 + 1;
            } while (lVar23 != 0);
          }
        }
        uVar21 = (uint)local_70;
        if ((x_optimistic->super_bit_array_impl).m_data._M_t.
            super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
            super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
            super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl != (unsigned_long *)0x0) {
          if ((int)uVar21 < 0) {
LAB_00183b92:
            uVar15 = 0;
          }
          else {
            uVar20 = (ulong)(uVar21 & 0x7fffffff);
            uVar19 = 0xffffffffffffffff;
            iVar18 = 0;
            piVar12 = &(local_68.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>.
                        _M_impl.super__Vector_impl_data._M_start)->factor;
            uVar11 = 0xfffffffe;
            do {
              uVar17 = uVar19 & 0xffffffff;
              if (pmVar10->max < iVar18) {
                uVar17 = uVar11;
              }
              if (iVar18 < pmVar10->min) {
                uVar17 = uVar11;
              }
              uVar19 = uVar19 + 1;
              iVar14 = (int)uVar17;
              if (((iVar14 != -2) && ((long)uVar19 < (long)uVar20)) &&
                 (((reduced_cost *)(piVar12 + -1))->value < 0.0)) break;
              if ((long)uVar19 < (long)uVar20) {
                iVar18 = iVar18 + *piVar12;
              }
              piVar12 = piVar12 + 3;
              uVar11 = uVar17;
            } while (uVar20 != uVar19);
            if (iVar14 < 0) goto LAB_00183b92;
            uVar15 = iVar14 + 1;
            lVar16 = 0;
            do {
              bit_array_impl::set(&x_optimistic->super_bit_array_impl,
                                  *(int *)((long)&(local_68.
                                                  super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->id +
                                          lVar16));
              lVar16 = lVar16 + 0xc;
            } while (uVar17 * 0xc + 0xc != lVar16);
            uVar21 = (uint)local_70;
          }
          if (uVar15 != uVar21) {
            lVar23 = (ulong)uVar15 - (ulong)uVar21;
            lVar16 = (ulong)uVar15 * 0xc + 8;
            do {
              bit_array_impl::unset
                        (&x_optimistic->super_bit_array_impl,
                         *(int *)((long)&(local_68.
                                          super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->value + lVar16
                                 ));
              lVar16 = lVar16 + 0xc;
              lVar23 = lVar23 + 1;
            } while (lVar23 != 0);
          }
        }
      }
      pmVar10 = pmVar10 + 1;
    } while (pmVar10 != local_40);
  }
  if (local_68.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>._M_impl.
      super__Vector_impl_data._M_start != (reduced_cost *)0x0) {
    operator_delete(local_68.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
LAB_00183a68:
  if ((long)uVar20 < (long)uVar11) {
    iVar18 = iVar18 + *piVar12;
  }
  uVar20 = uVar20 + 1;
  piVar12 = piVar12 + 3;
  if (uVar11 + 1 == uVar20) goto LAB_00183aa9;
  goto LAB_00183a5e;
}

Assistant:

void
init_with_pre_solve(bit_array& x_pessimistic,
                    bit_array& x_optimistic,
                    random_engine& rng,
                    const Cost& c,
                    const std::vector<merged_constraint>& constraints,
                    const double init_random) noexcept
{
    int max_length = 0;
    for (const auto& cst : constraints)
        if (length(cst.elements) > max_length)
            max_length = length(cst.elements);

    struct reduced_cost
    {
        float value;
        int factor;
        int id;
    };

    std::vector<reduced_cost> R(max_length);
    std::bernoulli_distribution dist(init_random);

    for (const auto& cst : constraints) {
        if (!dist(rng))
            continue;

        R.resize(cst.elements.size());
        const int r_size = length(cst.elements);

        for (int i = 0; i != r_size; ++i) {
            R[i].value = static_cast<float>(c[cst.elements[i].variable_index]);
            R[i].factor = cst.elements[i].factor;
            R[i].id = cst.elements[i].variable_index;
        }

        std::shuffle(std::begin(R), std::end(R), rng);
        std::sort(
          std::begin(R), std::end(R), [](const auto& lhs, const auto& rhs) {
              return is_better_solution<Mode>(lhs.value, rhs.value);
          });

        if (!x_pessimistic.empty()) {
            int sum = 0;
            int best = -2;

            for (int i = -1; i < r_size; ++i) {
                if (cst.min <= sum && sum <= cst.max) {
                    best = i;
                    break;
                }

                if (i + 1 < r_size)
                    sum += R[i + 1].factor;
            }

            int i = 0;
            for (; i <= best; ++i)
                x_pessimistic.set(R[i].id);

            for (; i != r_size; ++i) {
                x_pessimistic.unset(R[i].id);
            }
        }

        if (!x_optimistic.empty()) {
            int sum = 0;
            int best = -2;

            for (int i = -1; i < r_size; ++i) {
                if (cst.min <= sum && sum <= cst.max)
                    best = i;

                if (best != -2 && i + 1 < r_size &&
                    stop_iterating<Mode>(R[i + 1].value))
                    break;

                if (i + 1 < r_size)
                    sum += R[i + 1].factor;
            }

            int i = 0;
            for (; i <= best; ++i)
                x_optimistic.set(R[i].id);

            for (; i != r_size; ++i)
                x_optimistic.unset(R[i].id);
        }
    }
}